

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O2

void xmrig::cryptonight_quad_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  undefined1 (*pauVar1) [12];
  uint uVar2;
  cryptonight_ctx *pcVar3;
  cryptonight_ctx *pcVar4;
  cryptonight_ctx *pcVar5;
  cryptonight_ctx *pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  long lVar16;
  __m128i bx0;
  __m128i bx0_00;
  __m128i bx0_01;
  __m128i bx0_02;
  __m128i bx1;
  __m128i bx1_00;
  __m128i bx1_01;
  __m128i bx1_02;
  uint64_t *puVar17;
  uint8_t *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint64_t n0;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  size_t i;
  long lVar31;
  uint8_t *puVar32;
  ulong uVar33;
  size_t i_1;
  ulong uVar34;
  long extraout_XMM0_Qa;
  long extraout_XMM0_Qa_00;
  long extraout_XMM0_Qa_01;
  long extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i *palVar35;
  ulong uVar36;
  __m128i ax0;
  __m128i ax0_00;
  __m128i ax0_01;
  __m128i ax0_02;
  uint8_t *l;
  uint uVar37;
  undefined4 uVar38;
  uint uVar39;
  undefined4 uVar40;
  uint uVar41;
  undefined4 uVar42;
  uint uVar43;
  undefined4 uVar44;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  ulong local_228;
  ulong uStack_220;
  uint64_t *local_218;
  uint64_t *local_210;
  cryptonight_ctx **local_208;
  uint8_t *local_200;
  uint64_t *local_1f8;
  ulong uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  __m128i *local_1b8;
  ulong uStack_1b0;
  uint8_t *local_1a0;
  long local_198;
  undefined8 uStack_190;
  ulong local_188;
  undefined8 uStack_180;
  long local_178;
  undefined8 uStack_170;
  ulong local_168;
  undefined8 uStack_160;
  long local_158;
  undefined8 uStack_150;
  ulong local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  ulong uStack_80;
  uint8_t *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined8 uStack_40;
  
  local_208 = ctx;
  local_78 = output;
  for (lVar31 = 0; lVar31 != 4; lVar31 = lVar31 + 1) {
    pcVar3 = local_208[lVar31];
    keccak(input,size,pcVar3->state);
    cn_explode_scratchpad<true>((__m128i *)pcVar3,(__m128i *)pcVar3->memory);
    input = input + size;
  }
  pcVar3 = *local_208;
  pcVar4 = local_208[1];
  local_1a0 = pcVar3->memory;
  puVar32 = pcVar4->memory;
  pcVar5 = local_208[2];
  local_200 = pcVar5->memory;
  pcVar6 = local_208[3];
  l = pcVar6->memory;
  local_48 = *(ulong *)(pcVar3->state + 0x60);
  uStack_40 = 0;
  local_58 = *(long *)(pcVar3->state + 0x68);
  uStack_50 = 0;
  local_d8 = CONCAT44(*(uint *)(pcVar3->state + 0x24) ^ *(uint *)(pcVar3->state + 4),
                      *(uint *)(pcVar3->state + 0x20) ^ *(uint *)pcVar3->state);
  uStack_d0 = CONCAT44(*(uint *)(pcVar3->state + 0x2c) ^ *(uint *)(pcVar3->state + 0xc),
                       *(uint *)(pcVar3->state + 0x28) ^ *(uint *)(pcVar3->state + 8));
  local_138 = CONCAT44(*(uint *)(pcVar3->state + 0x34) ^ *(uint *)(pcVar3->state + 0x14),
                       *(uint *)(pcVar3->state + 0x30) ^ *(uint *)(pcVar3->state + 0x10));
  uStack_130 = CONCAT44(*(uint *)(pcVar3->state + 0x3c) ^ *(uint *)(pcVar3->state + 0x1c),
                        *(uint *)(pcVar3->state + 0x38) ^ *(uint *)(pcVar3->state + 0x18));
  local_1e8 = CONCAT44(*(uint *)(pcVar3->state + 0x54) ^ *(uint *)(pcVar3->state + 0x44),
                       *(uint *)(pcVar3->state + 0x50) ^ *(uint *)(pcVar3->state + 0x40));
  uStack_1e0 = CONCAT44(*(uint *)(pcVar3->state + 0x5c) ^ *(uint *)(pcVar3->state + 0x4c),
                        *(uint *)(pcVar3->state + 0x58) ^ *(uint *)(pcVar3->state + 0x48));
  local_148 = *(ulong *)(pcVar4->state + 0x60);
  uStack_140 = 0;
  local_e8 = CONCAT44(*(uint *)(pcVar4->state + 0x24) ^ *(uint *)(pcVar4->state + 4),
                      *(uint *)(pcVar4->state + 0x20) ^ *(uint *)pcVar4->state);
  uStack_e0 = CONCAT44(*(uint *)(pcVar4->state + 0x2c) ^ *(uint *)(pcVar4->state + 0xc),
                       *(uint *)(pcVar4->state + 0x28) ^ *(uint *)(pcVar4->state + 8));
  local_118 = CONCAT44(*(uint *)(pcVar4->state + 0x34) ^ *(uint *)(pcVar4->state + 0x14),
                       *(uint *)(pcVar4->state + 0x30) ^ *(uint *)(pcVar4->state + 0x10));
  uStack_110 = CONCAT44(*(uint *)(pcVar4->state + 0x3c) ^ *(uint *)(pcVar4->state + 0x1c),
                        *(uint *)(pcVar4->state + 0x38) ^ *(uint *)(pcVar4->state + 0x18));
  local_1d8 = CONCAT44(*(uint *)(pcVar4->state + 0x54) ^ *(uint *)(pcVar4->state + 0x44),
                       *(uint *)(pcVar4->state + 0x50) ^ *(uint *)(pcVar4->state + 0x40));
  uStack_1d0 = CONCAT44(*(uint *)(pcVar4->state + 0x5c) ^ *(uint *)(pcVar4->state + 0x4c),
                        *(uint *)(pcVar4->state + 0x58) ^ *(uint *)(pcVar4->state + 0x48));
  local_108 = CONCAT44(*(uint *)(pcVar5->state + 0x24) ^ *(uint *)(pcVar5->state + 4),
                       *(uint *)(pcVar5->state + 0x20) ^ *(uint *)pcVar5->state);
  uStack_100 = CONCAT44(*(uint *)(pcVar5->state + 0x2c) ^ *(uint *)(pcVar5->state + 0xc),
                        *(uint *)(pcVar5->state + 0x28) ^ *(uint *)(pcVar5->state + 8));
  local_128 = CONCAT44(*(uint *)(pcVar5->state + 0x34) ^ *(uint *)(pcVar5->state + 0x14),
                       *(uint *)(pcVar5->state + 0x30) ^ *(uint *)(pcVar5->state + 0x10));
  uStack_120 = CONCAT44(*(uint *)(pcVar5->state + 0x3c) ^ *(uint *)(pcVar5->state + 0x1c),
                        *(uint *)(pcVar5->state + 0x38) ^ *(uint *)(pcVar5->state + 0x18));
  local_1c8 = CONCAT44(*(uint *)(pcVar5->state + 0x54) ^ *(uint *)(pcVar5->state + 0x44),
                       *(uint *)(pcVar5->state + 0x50) ^ *(uint *)(pcVar5->state + 0x40));
  uStack_1c0 = CONCAT44(*(uint *)(pcVar5->state + 0x5c) ^ *(uint *)(pcVar5->state + 0x4c),
                        *(uint *)(pcVar5->state + 0x58) ^ *(uint *)(pcVar5->state + 0x48));
  local_f8 = CONCAT44(*(uint *)(pcVar6->state + 0x24) ^ *(uint *)(pcVar6->state + 4),
                      *(uint *)(pcVar6->state + 0x20) ^ *(uint *)pcVar6->state);
  uStack_f0 = CONCAT44(*(uint *)(pcVar6->state + 0x2c) ^ *(uint *)(pcVar6->state + 0xc),
                       *(uint *)(pcVar6->state + 0x28) ^ *(uint *)(pcVar6->state + 8));
  local_98 = CONCAT44(*(uint *)(pcVar6->state + 0x34) ^ *(uint *)(pcVar6->state + 0x14),
                      *(uint *)(pcVar6->state + 0x30) ^ *(uint *)(pcVar6->state + 0x10));
  uStack_90 = CONCAT44(*(uint *)(pcVar6->state + 0x3c) ^ *(uint *)(pcVar6->state + 0x1c),
                       *(uint *)(pcVar6->state + 0x38) ^ *(uint *)(pcVar6->state + 0x18));
  local_a8 = CONCAT44(*(uint *)(pcVar6->state + 0x54) ^ *(uint *)(pcVar6->state + 0x44),
                      *(uint *)(pcVar6->state + 0x50) ^ *(uint *)(pcVar6->state + 0x40));
  uStack_a0 = CONCAT44(*(uint *)(pcVar6->state + 0x5c) ^ *(uint *)(pcVar6->state + 0x4c),
                       *(uint *)(pcVar6->state + 0x58) ^ *(uint *)(pcVar6->state + 0x48));
  local_158 = *(long *)(pcVar4->state + 0x68);
  uStack_150 = 0;
  local_168 = *(ulong *)(pcVar5->state + 0x60);
  uStack_160 = 0;
  local_178 = *(long *)(pcVar5->state + 0x68);
  uStack_170 = 0;
  local_188 = *(ulong *)(pcVar6->state + 0x60);
  uStack_180 = 0;
  local_198 = *(long *)(pcVar6->state + 0x68);
  uStack_190 = 0;
  fesetround(0x400);
  uVar21 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  uVar24 = local_e8;
  uVar22 = local_108;
  uVar33 = local_d8;
  uVar26 = local_1e8;
  uVar36 = uStack_1e0;
  palVar35 = (__m128i *)local_138;
  uVar20 = uStack_130;
  while (puVar18 = local_200, uVar21 != 0) {
    uVar33 = uVar33 & 0xffff0;
    uVar28 = *(uint *)(local_1a0 + uVar33);
    uVar29 = *(uint *)(local_1a0 + uVar33 + 4);
    uVar30 = *(uint *)(local_1a0 + uVar33 + 8);
    uVar2 = *(uint *)(local_1a0 + uVar33 + 0xc);
    uVar24 = uVar24 & 0xffff0;
    local_1f8 = (uint64_t *)(puVar32 + uVar24);
    local_238 = *(ulong *)(puVar32 + uVar24);
    uStack_230 = *(ulong *)(puVar32 + uVar24 + 8);
    local_228 = uVar22 & 0xffff0;
    local_248 = *(ulong *)(local_200 + local_228);
    uStack_240 = *(ulong *)(local_200 + local_228 + 8);
    local_1b8 = (__m128i *)(local_f8 & 0xffff0);
    pauVar1 = (undefined1 (*) [12])(l + (long)local_1b8);
    uVar37 = (uint)*(undefined8 *)*pauVar1;
    uVar39 = (uint)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
    uVar41 = (uint)*(undefined8 *)(*pauVar1 + 8);
    uVar43 = (uint)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
    local_218 = (uint64_t *)(local_200 + local_228);
    local_210 = (uint64_t *)(l + (long)local_1b8);
    local_b8 = CONCAT44(saes_table[1][uVar30 >> 8 & 0xff] ^ saes_table[0][uVar29 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar28 >> 0x16 & 0xfffffffc)),
                        saes_table[1][uVar29 >> 8 & 0xff] ^ saes_table[0][uVar28 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar30 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar2 >> 0x16 & 0xfffffffc))) ^
               local_d8;
    uStack_b0 = CONCAT44(saes_table[1][uVar28 >> 8 & 0xff] ^ saes_table[0][uVar2 & 0xff] ^
                         *(uint *)((long)saes_table[2] + (ulong)(uVar29 >> 0xe & 0x3fc)) ^
                         *(uint *)((long)saes_table[3] + (ulong)(uVar30 >> 0x16 & 0xfffffffc)),
                         saes_table[1][uVar2 >> 8 & 0xff] ^ saes_table[0][uVar30 & 0xff] ^
                         *(uint *)((long)saes_table[2] + (ulong)(uVar28 >> 0xe & 0x3fc)) ^
                         *(uint *)((long)saes_table[3] + (ulong)(uVar29 >> 0x16 & 0xfffffffc))) ^
                uStack_d0;
    bx0[1] = (longlong)puVar32;
    bx0[0] = (longlong)l;
    bx1[1]._4_4_ = uVar43;
    bx1._0_12_ = *pauVar1;
    ax0[1] = (longlong)local_218;
    ax0[0] = (longlong)&local_88;
    local_1e8 = uVar26;
    uStack_1e0 = uVar36;
    local_138 = (ulong)palVar35;
    uStack_130 = uVar20;
    local_88 = local_b8;
    uStack_80 = uStack_b0;
    local_60 = uVar21 - 1;
    cryptonight_monero_tweak
              ((uint64_t *)(local_1a0 + uVar33),local_1a0,uVar33,ax0,bx0,bx1,local_1b8);
    uVar29 = (uint)local_238 >> 8;
    uVar30 = local_238._4_4_ >> 0xe;
    ax0_00[1]._0_4_ = uStack_230._4_4_ >> 0x16 & 0xfffffffc;
    uVar28 = saes_table[1][uStack_230._4_4_ >> 8 & 0xff] ^ saes_table[0][(uint)uStack_230 & 0xff] ^
             *(uint *)((long)saes_table[2] + (ulong)((uint)local_238 >> 0xe & 0x3fc)) ^
             *(uint *)((long)saes_table[3] + (ulong)(local_238._4_4_ >> 0x16 & 0xfffffffc));
    local_238 = CONCAT44(saes_table[1][(uint)uStack_230 >> 8 & 0xff] ^
                         saes_table[0][local_238._4_4_ & 0xff] ^
                         *(uint *)((long)saes_table[2] + (ulong)(uStack_230._4_4_ >> 0xe & 0x3fc)) ^
                         *(uint *)((long)saes_table[3] +
                                  (ulong)((uint)local_238 >> 0x16 & 0xfffffffc)),
                         saes_table[1][local_238._4_4_ >> 8 & 0xff] ^
                         saes_table[0][(uint)local_238 & 0xff] ^
                         *(uint *)((long)saes_table[2] + (ulong)((uint)uStack_230 >> 0xe & 0x3fc)) ^
                         *(uint *)((long)saes_table[3] + (ulong)(uint)ax0_00[1])) ^ local_e8;
    uStack_230 = CONCAT44(saes_table[1][uVar29 & 0xff] ^ saes_table[0][uStack_230._4_4_ & 0xff] ^
                          *(uint *)((long)saes_table[2] + (ulong)(uVar30 & 0x3fc)) ^
                          *(uint *)((long)saes_table[3] +
                                   (ulong)((uint)uStack_230 >> 0x16 & 0xfffffffc)),uVar28) ^
                 uStack_e0;
    bx0_00[1] = (longlong)puVar32;
    bx0_00[0] = (longlong)l;
    bx1_00[0]._4_4_ = uVar39;
    bx1_00[0]._0_4_ = uVar37;
    bx1_00[1]._0_4_ = uVar41;
    bx1_00[1]._4_4_ = uVar43;
    ax0_00[0] = (longlong)&local_238;
    ax0_00[1]._4_4_ = 0;
    local_c8 = local_238;
    uStack_c0 = uStack_230;
    cryptonight_monero_tweak(local_1f8,puVar32,uVar24,ax0_00,bx0_00,bx1_00,(__m128i *)(ulong)uVar28)
    ;
    uVar29 = (uint)local_248 >> 8;
    uVar30 = local_248._4_4_ >> 0xe;
    ax0_01[1]._0_4_ = uStack_240._4_4_ >> 0x16 & 0xfffffffc;
    uVar28 = saes_table[1][uStack_240._4_4_ >> 8 & 0xff] ^ saes_table[0][(uint)uStack_240 & 0xff] ^
             *(uint *)((long)saes_table[2] + (ulong)((uint)local_248 >> 0xe & 0x3fc)) ^
             *(uint *)((long)saes_table[3] + (ulong)(local_248._4_4_ >> 0x16 & 0xfffffffc));
    local_248 = CONCAT44(saes_table[1][(uint)uStack_240 >> 8 & 0xff] ^
                         saes_table[0][local_248._4_4_ & 0xff] ^
                         *(uint *)((long)saes_table[2] + (ulong)(uStack_240._4_4_ >> 0xe & 0x3fc)) ^
                         *(uint *)((long)saes_table[3] +
                                  (ulong)((uint)local_248 >> 0x16 & 0xfffffffc)),
                         saes_table[1][local_248._4_4_ >> 8 & 0xff] ^
                         saes_table[0][(uint)local_248 & 0xff] ^
                         *(uint *)((long)saes_table[2] + (ulong)((uint)uStack_240 >> 0xe & 0x3fc)) ^
                         *(uint *)((long)saes_table[3] + (ulong)(uint)ax0_01[1])) ^ local_108;
    uStack_240 = CONCAT44(saes_table[1][uVar29 & 0xff] ^ saes_table[0][uStack_240._4_4_ & 0xff] ^
                          *(uint *)((long)saes_table[2] + (ulong)(uVar30 & 0x3fc)) ^
                          *(uint *)((long)saes_table[3] +
                                   (ulong)((uint)uStack_240 >> 0x16 & 0xfffffffc)),uVar28) ^
                 uStack_100;
    bx0_01[1] = (longlong)puVar32;
    bx0_01[0] = (longlong)l;
    bx1_01[0]._4_4_ = uVar39;
    bx1_01[0]._0_4_ = uVar37;
    bx1_01[1]._0_4_ = uVar41;
    bx1_01[1]._4_4_ = uVar43;
    ax0_01[0] = (longlong)&local_248;
    ax0_01[1]._4_4_ = 0;
    local_1f8 = (uint64_t *)local_248;
    uStack_1f0 = uStack_240;
    cryptonight_monero_tweak
              (local_218,puVar18,local_228,ax0_01,bx0_01,bx1_01,(__m128i *)(ulong)uVar28);
    ax0_02[1]._0_4_ = uVar43 >> 0x16 & 0xfffffffc;
    uVar28 = saes_table[1][uVar43 >> 8 & 0xff] ^ saes_table[0][uVar41 & 0xff] ^
             *(uint *)((long)saes_table[2] + (ulong)(uVar37 >> 0xe & 0x3fc)) ^
             *(uint *)((long)saes_table[3] + (ulong)(uVar39 >> 0x16 & 0xfffffffc));
    local_228 = CONCAT44(saes_table[1][uVar41 >> 8 & 0xff] ^ saes_table[0][uVar39 & 0xff] ^
                         *(uint *)((long)saes_table[2] + (ulong)(uVar43 >> 0xe & 0x3fc)) ^
                         *(uint *)((long)saes_table[3] + (ulong)(uVar37 >> 0x16 & 0xfffffffc)),
                         saes_table[1][uVar39 >> 8 & 0xff] ^ saes_table[0][uVar37 & 0xff] ^
                         *(uint *)((long)saes_table[2] + (ulong)(uVar41 >> 0xe & 0x3fc)) ^
                         *(uint *)((long)saes_table[3] + (ulong)(uint)ax0_02[1])) ^ local_f8;
    uStack_220 = CONCAT44(saes_table[1][uVar37 >> 8 & 0xff] ^ saes_table[0][uVar43 & 0xff] ^
                          *(uint *)((long)saes_table[2] + (ulong)(uVar39 >> 0xe & 0x3fc)) ^
                          *(uint *)((long)saes_table[3] + (ulong)(uVar41 >> 0x16 & 0xfffffffc)),
                          uVar28) ^ uStack_f0;
    uVar38 = (undefined4)local_228;
    uVar40 = (undefined4)(local_228 >> 0x20);
    uVar42 = (undefined4)uStack_220;
    uVar44 = (undefined4)(uStack_220 >> 0x20);
    bx0_02[1] = (longlong)puVar32;
    bx0_02[0] = (longlong)l;
    bx1_02[1]._0_4_ = uVar42;
    bx1_02[0] = local_228;
    bx1_02[1]._4_4_ = uVar44;
    ax0_02[0] = (longlong)&stack0xfffffffffffffda8;
    ax0_02[1]._4_4_ = 0;
    cryptonight_monero_tweak
              (local_210,l,(uint64_t)local_1b8,ax0_02,bx0_02,bx1_02,(__m128i *)(ulong)uVar28);
    uVar21 = local_b8;
    puVar18 = local_1a0;
    uVar25 = local_b8 & 0xffff0;
    uVar33 = local_58 << 0x20 ^ local_48 ^ *(ulong *)(local_1a0 + uVar25);
    local_1b8 = (__m128i *)local_88;
    uStack_1b0 = uStack_80;
    uVar24 = (ulong)((int)local_b8 + (int)local_58 * 2 & 0x7ffffffe) | 0x80000001;
    local_70 = local_c8;
    uVar34 = local_c8 & 0xffff0;
    local_218 = local_1f8;
    local_1f8 = (uint64_t *)((ulong)local_1f8 & 0xffff0);
    local_48 = uStack_80 / uVar24 & 0xffffffff | uStack_80 % uVar24 << 0x20;
    local_68 = local_178 << 0x20 ^ local_168;
    uVar22 = local_198 << 0x20 ^ local_188;
    local_c8 = local_228;
    uVar26 = local_228 & 0xffff0;
    uStack_40 = 0;
    n0 = local_48 + local_b8;
    uVar24 = local_158 << 0x20 ^ local_148 ^ *(ulong *)(puVar32 + uVar34);
    local_148 = *(ulong *)(local_1a0 + uVar25 + 8);
    uStack_140 = 0;
    local_168 = *(ulong *)(puVar32 + uVar34 + 8);
    uStack_160 = 0;
    local_68 = local_68 ^ *(ulong *)(local_200 + (long)local_1f8);
    local_188 = *(ulong *)(local_200 + (long)local_1f8 + 8);
    uStack_180 = 0;
    local_210 = (uint64_t *)(uVar22 ^ *(ulong *)(l + uVar26));
    local_228 = *(ulong *)(l + uVar26 + 8);
    uStack_220 = 0;
    local_b8 = uVar26;
    int_sqrt_v2(n0);
    uVar20 = local_70;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar33;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar21;
    uVar23 = SUB168(auVar7 * auVar11,8);
    uVar19 = SUB168(auVar7 * auVar11,0);
    uVar26 = *(ulong *)(puVar18 + (uVar25 ^ 0x10));
    uVar36 = *(ulong *)((long)(puVar18 + (uVar25 ^ 0x10)) + 8);
    uVar27 = uVar25 ^ 0x20;
    uVar21 = *(ulong *)(puVar18 + uVar27);
    uVar22 = *(ulong *)(puVar18 + uVar27 + 8);
    lVar31 = *(long *)((long)(puVar18 + (uVar25 ^ 0x30)) + 8);
    lVar15 = *(long *)(puVar18 + uVar27);
    lVar16 = *(long *)((long)(puVar18 + uVar27) + 8);
    *(ulong *)(puVar18 + (uVar25 ^ 0x10)) = local_1e8 + *(long *)(puVar18 + (uVar25 ^ 0x30));
    *(ulong *)((long)(puVar18 + (uVar25 ^ 0x10)) + 8) = uStack_1e0 + lVar31;
    *(ulong *)(puVar18 + uVar27) = (uVar23 ^ uVar26) + local_138;
    *(ulong *)((long)(puVar18 + uVar27) + 8) = (uVar19 ^ uVar36) + uStack_130;
    *(ulong *)(puVar18 + (uVar25 ^ 0x30)) = lVar15 + local_d8;
    *(ulong *)((long)(puVar18 + (uVar25 ^ 0x30)) + 8) = lVar16 + uStack_d0;
    local_d8 = (uVar23 ^ uVar21) + local_d8;
    uStack_d0 = (uVar19 ^ uVar22) + uStack_d0;
    *(ulong *)(puVar18 + uVar25) = local_d8;
    *(ulong *)((long)(puVar18 + uVar25) + 8) = uStack_d0;
    local_1e8 = local_238;
    uStack_1e0 = uStack_230;
    uVar21 = (ulong)((int)local_70 + (int)local_158 * 2 & 0x7ffffffe) | 0x80000001;
    uVar33 = uVar33 ^ local_d8;
    uStack_d0 = local_148 ^ uStack_d0;
    local_148 = uStack_230 / uVar21 & 0xffffffff | uStack_230 % uVar21 << 0x20;
    uStack_140 = 0;
    local_d8 = uVar33;
    local_58 = extraout_XMM0_Qa;
    uStack_50 = extraout_XMM0_Qb;
    int_sqrt_v2(local_148 + local_70);
    puVar17 = local_218;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar24;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar20;
    uVar19 = SUB168(auVar8 * auVar12,8);
    uVar20 = SUB168(auVar8 * auVar12,0);
    uVar26 = *(ulong *)(puVar32 + (uVar34 ^ 0x10));
    uVar36 = *(ulong *)((long)(puVar32 + (uVar34 ^ 0x10)) + 8);
    uVar23 = uVar34 ^ 0x20;
    uVar21 = *(ulong *)(puVar32 + uVar23);
    uVar22 = *(ulong *)(puVar32 + uVar23 + 8);
    lVar31 = *(long *)((long)(puVar32 + (uVar34 ^ 0x30)) + 8);
    lVar15 = *(long *)(puVar32 + uVar23);
    lVar16 = *(long *)((long)(puVar32 + uVar23) + 8);
    *(ulong *)(puVar32 + (uVar34 ^ 0x10)) = local_1d8 + *(long *)(puVar32 + (uVar34 ^ 0x30));
    *(ulong *)((long)(puVar32 + (uVar34 ^ 0x10)) + 8) = uStack_1d0 + lVar31;
    *(ulong *)(puVar32 + uVar23) = (uVar19 ^ uVar26) + local_118;
    *(ulong *)((long)(puVar32 + uVar23) + 8) = (uVar20 ^ uVar36) + uStack_110;
    *(ulong *)(puVar32 + (uVar34 ^ 0x30)) = lVar15 + local_e8;
    *(ulong *)((long)(puVar32 + (uVar34 ^ 0x30)) + 8) = lVar16 + uStack_e0;
    local_e8 = (uVar19 ^ uVar21) + local_e8;
    uStack_e0 = (uVar20 ^ uVar22) + uStack_e0;
    *(ulong *)(puVar32 + uVar34) = local_e8;
    *(ulong *)((long)(puVar32 + uVar34) + 8) = uStack_e0;
    local_1d8 = local_248;
    uStack_1d0 = uStack_240;
    uVar21 = (ulong)((int)local_218 + (int)local_178 * 2 & 0x7ffffffe) | 0x80000001;
    uVar24 = uVar24 ^ local_e8;
    uStack_e0 = local_168 ^ uStack_e0;
    local_168 = uStack_240 / uVar21 & 0xffffffff | uStack_240 % uVar21 << 0x20;
    uStack_160 = 0;
    local_158 = extraout_XMM0_Qa_00;
    uStack_150 = extraout_XMM0_Qb_00;
    local_e8 = uVar24;
    int_sqrt_v2(local_168 + (long)local_218);
    uVar20 = local_c8;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_68;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = puVar17;
    uVar23 = SUB168(auVar9 * auVar13,8);
    uVar19 = SUB168(auVar9 * auVar13,0);
    uVar26 = *(ulong *)(local_200 + ((ulong)local_1f8 ^ 0x10));
    uVar36 = *(ulong *)((long)(local_200 + ((ulong)local_1f8 ^ 0x10)) + 8);
    uVar25 = (ulong)local_1f8 ^ 0x20;
    uVar21 = *(ulong *)(local_200 + uVar25);
    uVar22 = *(ulong *)(local_200 + uVar25 + 8);
    lVar31 = *(long *)((long)(local_200 + ((ulong)local_1f8 ^ 0x30)) + 8);
    lVar15 = *(long *)(local_200 + uVar25);
    lVar16 = *(long *)((long)(local_200 + uVar25) + 8);
    *(ulong *)(local_200 + ((ulong)local_1f8 ^ 0x10)) =
         local_1c8 + *(long *)(local_200 + ((ulong)local_1f8 ^ 0x30));
    *(ulong *)((long)(local_200 + ((ulong)local_1f8 ^ 0x10)) + 8) = uStack_1c0 + lVar31;
    *(ulong *)(local_200 + uVar25) = (uVar23 ^ uVar26) + local_128;
    *(ulong *)((long)(local_200 + uVar25) + 8) = (uVar19 ^ uVar36) + uStack_120;
    *(ulong *)(local_200 + ((ulong)local_1f8 ^ 0x30)) = lVar15 + local_108;
    *(ulong *)((long)(local_200 + ((ulong)local_1f8 ^ 0x30)) + 8) = lVar16 + uStack_100;
    local_108 = (uVar23 ^ uVar21) + local_108;
    uStack_100 = (uVar19 ^ uVar22) + uStack_100;
    *(ulong *)(local_200 + (long)local_1f8) = local_108;
    *(ulong *)((long)(local_200 + (long)local_1f8) + 8) = uStack_100;
    local_1c8 = CONCAT44(uVar40,uVar38);
    uStack_1c0 = CONCAT44(uVar44,uVar42);
    uVar21 = (ulong)((int)local_c8 + (int)local_198 * 2 & 0x7ffffffe) | 0x80000001;
    uVar22 = local_68 ^ local_108;
    uStack_100 = local_188 ^ uStack_100;
    local_188 = CONCAT44(uVar44,uVar42) / uVar21 & 0xffffffff |
                CONCAT44(uVar44,uVar42) % uVar21 << 0x20;
    uStack_180 = 0;
    local_178 = extraout_XMM0_Qa_01;
    uStack_170 = extraout_XMM0_Qb_01;
    local_108 = uVar22;
    int_sqrt_v2(local_188 + local_c8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_210;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar20;
    uVar23 = SUB168(auVar10 * auVar14,8);
    uVar19 = SUB168(auVar10 * auVar14,0);
    uVar36 = *(ulong *)(l + (local_b8 ^ 0x10));
    uVar20 = *(ulong *)((long)(l + (local_b8 ^ 0x10)) + 8);
    uVar25 = local_b8 ^ 0x20;
    uVar21 = *(ulong *)(l + uVar25);
    uVar26 = *(ulong *)(l + uVar25 + 8);
    lVar31 = *(long *)((long)(l + (local_b8 ^ 0x30)) + 8);
    lVar15 = *(long *)(l + uVar25);
    lVar16 = *(long *)((long)(l + uVar25) + 8);
    *(long *)(l + (local_b8 ^ 0x10)) = local_a8 + *(long *)(l + (local_b8 ^ 0x30));
    *(long *)((long)(l + (local_b8 ^ 0x10)) + 8) = uStack_a0 + lVar31;
    local_a8 = local_98;
    uStack_a0 = uStack_90;
    *(ulong *)(l + uVar25) = (uVar23 ^ uVar36) + local_98;
    *(ulong *)((long)(l + uVar25) + 8) = (uVar19 ^ uVar20) + uStack_90;
    *(ulong *)(l + (local_b8 ^ 0x30)) = lVar15 + local_f8;
    *(ulong *)((long)(l + (local_b8 ^ 0x30)) + 8) = lVar16 + uStack_f0;
    local_f8 = (uVar23 ^ uVar21) + local_f8;
    uStack_f0 = (uVar19 ^ uVar26) + uStack_f0;
    *(ulong *)(l + local_b8) = local_f8;
    *(ulong *)((long)(l + local_b8) + 8) = uStack_f0;
    local_f8 = (ulong)local_210 ^ local_f8;
    uStack_f0 = local_228 ^ uStack_f0;
    local_98 = local_1c8;
    uStack_90 = uStack_1c0;
    local_1c8 = local_128;
    uStack_1c0 = uStack_120;
    local_128 = local_1d8;
    uStack_120 = uStack_1d0;
    local_1d8 = local_118;
    uStack_1d0 = uStack_110;
    local_118 = local_1e8;
    uStack_110 = uStack_1e0;
    uVar21 = local_60;
    uVar26 = local_138;
    uVar36 = uStack_130;
    palVar35 = local_1b8;
    uVar20 = uStack_1b0;
    local_198 = extraout_XMM0_Qa_02;
    uStack_190 = extraout_XMM0_Qb_02;
  }
  puVar32 = local_78;
  for (lVar31 = 0; lVar31 != 4; lVar31 = lVar31 + 1) {
    pcVar3 = local_208[lVar31];
    cn_implode_scratchpad<true>((__m128i *)pcVar3->memory,(__m128i *)pcVar3);
    keccakf((uint64_t *)pcVar3,0x18);
    (*(code *)(&extra_hashes)[(byte)*(longlong *)pcVar3->state & 3])(pcVar3,200,puVar32);
    puVar32 = puVar32 + 0x20;
  }
  return;
}

Assistant:

inline void cryptonight_quad_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    for (size_t i = 0; i < 4; i++) {
        keccak(input + size * i, size, ctx[i]->state);
        cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->state), reinterpret_cast<__m128i*>(ctx[i]->memory));
    }

    uint8_t* l0  = ctx[0]->memory;
    uint8_t* l1  = ctx[1]->memory;
    uint8_t* l2  = ctx[2]->memory;
    uint8_t* l3  = ctx[3]->memory;
    uint64_t* h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t* h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);
    uint64_t* h2 = reinterpret_cast<uint64_t*>(ctx[2]->state);
    uint64_t* h3 = reinterpret_cast<uint64_t*>(ctx[3]->state);

    CONST_INIT(ctx[0], 0);
    CONST_INIT(ctx[1], 1);
    CONST_INIT(ctx[2], 2);
    CONST_INIT(ctx[3], 3);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t idx0, idx1, idx2, idx3;
    idx0 = _mm_cvtsi128_si64(ax0);
    idx1 = _mm_cvtsi128_si64(ax1);
    idx2 = _mm_cvtsi128_si64(ax2);
    idx3 = _mm_cvtsi128_si64(ax3);

    for (size_t i = 0; i < iters; i++) {
        uint64_t hi, lo;
        __m128i *ptr0, *ptr1, *ptr2, *ptr3;

        CN_STEP1(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP1(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP1(ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP1(ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP2(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP2(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP2(ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP2(ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP3(0, ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP3(1, ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP3(2, ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP3(3, ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP4(0, ax0, bx00, bx01, cx0, l0, mc0, ptr0, idx0);
        CN_STEP4(1, ax1, bx10, bx11, cx1, l1, mc1, ptr1, idx1);
        CN_STEP4(2, ax2, bx20, bx21, cx2, l2, mc2, ptr2, idx2);
        CN_STEP4(3, ax3, bx30, bx31, cx3, l3, mc3, ptr3, idx3);
    }

    for (size_t i = 0; i < 4; i++) {
        cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->memory), reinterpret_cast<__m128i*>(ctx[i]->state));
        keccakf(reinterpret_cast<uint64_t*>(ctx[i]->state), 24);
        extra_hashes[ctx[i]->state[0] & 3](ctx[i]->state, 200, output + 32 * i);
    }
}